

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::Invalidate(GLContextState *this)

{
  Char *Message;
  EnableStateHelper local_90;
  uint local_8c;
  FILL_MODE FStack_88;
  CULL_MODE CStack_87;
  undefined2 uStack_86;
  Uint32 rt;
  float local_80;
  float fStack_7c;
  EnableStateHelper local_78;
  EnableStateHelper EStack_74;
  DepthStencilGLState local_70;
  undefined1 local_38 [8];
  string msg;
  GLenum err;
  GLContextState *this_local;
  
  if (this->m_PendingMemoryBarriers != MEMORY_BARRIER_NONE) {
    EnsureMemoryBarrier(this,this->m_PendingMemoryBarriers,(AsyncWritableResource *)0x0);
  }
  this->m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (*__glewUseProgram)(0);
  if (((this->m_Caps).IsProgramPipelineSupported & 1U) != 0) {
    (*__glewBindProgramPipeline)(0);
  }
  (*__glewBindVertexArray)(0);
  (*__glewBindFramebuffer)(0x8ca9,0);
  (*__glewBindFramebuffer)(0x8ca8,0);
  msg.field_2._12_4_ = glGetError();
  if (msg.field_2._12_4_ != 0) {
    LogError<false,char[33],char[17],unsigned_int>
              (false,"Invalidate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,99,(char (*) [33])"Failed to reset GL context state",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 0xc));
    FormatString<char[6]>((string *)local_38,(char (*) [6])0x4585f6);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Invalidate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,99);
    std::__cxx11::string::~string((string *)local_38);
  }
  this->m_GLProgId = -1;
  this->m_GLPipelineId = -1;
  this->m_VAOId = -1;
  this->m_FBOId = -1;
  std::
  vector<Diligent::GLContextState::BoundTextureInfo,_std::allocator<Diligent::GLContextState::BoundTextureInfo>_>
  ::clear(&this->m_BoundTextures);
  std::vector<int,_std::allocator<int>_>::clear(&this->m_BoundSamplers);
  std::
  vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
  ::clear(&this->m_BoundImages);
  std::
  vector<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
  ::clear(&this->m_BoundUniformBuffers);
  std::
  vector<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
  ::clear(&this->m_BoundStorageBlocks);
  memset(&local_70,0,0x2c);
  DepthStencilGLState::DepthStencilGLState(&local_70);
  memcpy(&this->m_DSState,&local_70,0x2c);
  memset(&stack0xffffffffffffff78,0,0x18);
  RasterizerGLState::RasterizerGLState((RasterizerGLState *)&stack0xffffffffffffff78);
  (this->m_RSState).FillMode = FStack_88;
  (this->m_RSState).CullMode = CStack_87;
  *(undefined2 *)&(this->m_RSState).field_0x2 = uStack_86;
  (this->m_RSState).FrontCounterClockwise = (EnableStateHelper)rt;
  (this->m_RSState).fDepthBias = local_80;
  (this->m_RSState).fSlopeScaledDepthBias = fStack_7c;
  (this->m_RSState).DepthClampEnable = (EnableStateHelper)local_78.m_EnableState;
  (this->m_RSState).ScissorTestEnable = (EnableStateHelper)EStack_74.m_EnableState;
  for (local_8c = 0; local_8c < 8; local_8c = local_8c + 1) {
    this->m_ColorWriteMasks[local_8c] = 0xff;
  }
  memset(&local_90,0,4);
  EnableStateHelper::EnableStateHelper(&local_90);
  (this->m_bIndexedWriteMasks).m_EnableState = local_90.m_EnableState;
  this->m_iActiveTexture = -1;
  this->m_NumPatchVertices = -1;
  return;
}

Assistant:

void GLContextState::Invalidate()
{
#if !PLATFORM_ANDROID
    // On Android this results in OpenGL error, so we will not
    // clear the barriers. All the required barriers will be
    // executed next frame when needed
    if (m_PendingMemoryBarriers != 0)
        EnsureMemoryBarrier(m_PendingMemoryBarriers);
    m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
#endif

    // Unity messes up at least VAO left in the context,
    // so unbid what we bound
    glUseProgram(0);
    if (m_Caps.IsProgramPipelineSupported)
        glBindProgramPipeline(0);

    glBindVertexArray(0);
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
    DEV_CHECK_GL_ERROR("Failed to reset GL context state");

    m_GLProgId     = -1;
    m_GLPipelineId = -1;
    m_VAOId        = -1;
    m_FBOId        = -1;

    m_BoundTextures.clear();
    m_BoundSamplers.clear();
    m_BoundImages.clear();
    m_BoundUniformBuffers.clear();
    m_BoundStorageBlocks.clear();

    m_DSState = DepthStencilGLState();
    m_RSState = RasterizerGLState();

    for (Uint32 rt = 0; rt < _countof(m_ColorWriteMasks); ++rt)
        m_ColorWriteMasks[rt] = 0xFF;

    m_bIndexedWriteMasks = EnableStateHelper();

    m_iActiveTexture   = -1;
    m_NumPatchVertices = -1;
}